

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitMatrix.h
# Opt level: O1

BitMatrix *
ZXing::ToBitMatrix<ZXing::Trit>
          (BitMatrix *__return_storage_ptr__,Matrix<ZXing::Trit> *in,Trit trueValue)

{
  pointer puVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  
  BitMatrix::BitMatrix(__return_storage_ptr__,in->_width,in->_height);
  if (0 < in->_height) {
    iVar2 = 0;
    do {
      iVar4 = in->_width;
      if (0 < iVar4) {
        lVar3 = 0;
        do {
          if (((in->_data).super__Vector_base<ZXing::Trit,_std::allocator<ZXing::Trit>_>._M_impl.
               super__Vector_impl_data._M_start[lVar3 + iVar4 * iVar2].value == true_v) ==
              (trueValue.value == true_v)) {
            lVar5 = (long)(__return_storage_ptr__->_width * iVar2);
            puVar1 = (__return_storage_ptr__->_bits).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if ((ulong)((long)(__return_storage_ptr__->_bits).
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)puVar1) <=
                (ulong)(lVar3 + lVar5)) {
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                        );
            }
            puVar1[lVar3 + lVar5] = 0xff;
          }
          iVar4 = in->_width;
          lVar3 = lVar3 + 1;
        } while ((int)lVar3 < iVar4);
      }
      iVar2 = iVar2 + 1;
    } while (iVar2 < in->_height);
  }
  return __return_storage_ptr__;
}

Assistant:

BitMatrix ToBitMatrix(const Matrix<T>& in, T trueValue = {true})
{
	BitMatrix out(in.width(), in.height());
	for (int y = 0; y < in.height(); ++y)
		for (int x = 0; x < in.width(); ++x)
			if (in.get(x, y) == trueValue)
				out.set(x, y);
	return out;
}